

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_fwd_txfm_avx2.c
# Opt level: O2

void fadst16_avx2(__m256i *in,__m256i *out,int8_t bit,int num_cols,int outstride)

{
  undefined8 *puVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  int iVar66;
  int iVar67;
  int iVar68;
  int iVar69;
  int iVar70;
  int iVar71;
  int iVar72;
  int iVar73;
  uint uVar74;
  int iVar75;
  int iVar76;
  int iVar77;
  int iVar78;
  undefined7 in_register_00000011;
  int iVar79;
  long lVar80;
  ulong uVar81;
  long lVar82;
  undefined1 auVar83 [16];
  undefined8 local_6f8;
  undefined8 uStack_6f0;
  undefined8 uStack_6e8;
  undefined8 uStack_6e0;
  undefined8 local_6a8;
  undefined8 uStack_6a0;
  undefined8 uStack_698;
  undefined8 uStack_690;
  undefined8 local_688;
  undefined8 uStack_680;
  undefined8 uStack_678;
  undefined8 uStack_670;
  undefined8 local_648;
  undefined8 uStack_640;
  undefined8 uStack_638;
  undefined8 uStack_630;
  undefined8 local_628;
  undefined8 uStack_620;
  undefined8 uStack_618;
  undefined8 uStack_610;
  
  uVar74 = (uint)CONCAT71(in_register_00000011,bit);
  lVar82 = (long)(int)uVar74 * 0x100;
  iVar16 = *(int *)((long)vert_filter_length_chroma + lVar82 + 0x220);
  iVar17 = *(int *)((long)vert_filter_length_chroma + lVar82 + 0x1a0);
  iVar75 = -iVar17;
  iVar66 = -iVar16;
  iVar18 = *(int *)((long)vert_filter_length_chroma + lVar82 + 0x168);
  iVar19 = *(int *)((long)vert_filter_length_chroma + lVar82 + 0x180);
  iVar20 = *(int *)((long)vert_filter_length_chroma + lVar82 + 0x240);
  iVar79 = -iVar20;
  iVar76 = -iVar19;
  iVar21 = *(int *)((long)vert_filter_length_chroma + lVar82 + 0x200);
  iVar77 = -iVar21;
  iVar67 = -iVar18;
  iVar22 = *(int *)((long)vert_filter_length_chroma + lVar82 + 0x188);
  iVar68 = -iVar22;
  iVar23 = *(int *)((long)vert_filter_length_chroma + lVar82 + 0x1a8);
  iVar69 = -iVar23;
  iVar24 = *(int *)((long)vert_filter_length_chroma + lVar82 + 0x1c8);
  iVar70 = -iVar24;
  iVar25 = *(int *)((long)vert_filter_length_chroma + lVar82 + 0x1e8);
  iVar71 = -iVar25;
  iVar26 = *(int *)((long)vert_filter_length_chroma + lVar82 + 0x208);
  iVar72 = -iVar26;
  iVar27 = *(int *)((long)vert_filter_length_chroma + lVar82 + 0x228);
  iVar73 = -iVar27;
  iVar78 = 1 << (bit - 1U & 0x1f);
  lVar80 = 0;
  uVar81 = 0;
  if (0 < num_cols) {
    uVar81 = (ulong)(uint)num_cols;
  }
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar82 + 0x1e0);
  uVar3 = *(undefined4 *)((long)vert_filter_length_chroma + lVar82 + 0x1c0);
  uVar4 = *(undefined4 *)((long)vert_filter_length_chroma + lVar82 + 600);
  uVar5 = *(undefined4 *)((long)vert_filter_length_chroma + lVar82 + 0x238);
  uVar6 = *(undefined4 *)((long)vert_filter_length_chroma + lVar82 + 0x218);
  uVar7 = *(undefined4 *)((long)vert_filter_length_chroma + lVar82 + 0x1f8);
  uVar8 = *(undefined4 *)((long)vert_filter_length_chroma + lVar82 + 0x1d8);
  uVar9 = *(undefined4 *)((long)vert_filter_length_chroma + lVar82 + 0x1b8);
  uVar10 = *(undefined4 *)((long)vert_filter_length_chroma + lVar82 + 0x198);
  uVar11 = *(undefined4 *)((long)vert_filter_length_chroma + lVar82 + 0x248);
  uVar12 = *(undefined4 *)((long)vert_filter_length_chroma + lVar82 + 0x178);
  auVar49._4_4_ = iVar78;
  auVar49._0_4_ = iVar78;
  auVar49._8_4_ = iVar78;
  auVar49._12_4_ = iVar78;
  auVar49._16_4_ = iVar78;
  auVar49._20_4_ = iVar78;
  auVar49._24_4_ = iVar78;
  auVar49._28_4_ = iVar78;
  for (; uVar81 << 5 != lVar80; lVar80 = lVar80 + 0x20) {
    auVar13 = *(undefined1 (*) [32])((long)*in + lVar80);
    auVar14 = *(undefined1 (*) [32])((long)in[num_cols * 0xf] + lVar80);
    auVar42 = *(undefined1 (*) [32])((long)in[num_cols * 3] + lVar80);
    auVar40._4_4_ = uVar2;
    auVar40._0_4_ = uVar2;
    auVar40._8_4_ = uVar2;
    auVar40._12_4_ = uVar2;
    auVar40._16_4_ = uVar2;
    auVar40._20_4_ = uVar2;
    auVar40._24_4_ = uVar2;
    auVar40._28_4_ = uVar2;
    auVar28 = vpmulld_avx2(auVar40,*(undefined1 (*) [32])((long)in[num_cols * 7] + lVar80));
    auVar29 = vpmulld_avx2(auVar40,*(undefined1 (*) [32])((long)in[num_cols * 8] + lVar80));
    auVar15 = *(undefined1 (*) [32])((long)in[num_cols * 0xc] + lVar80);
    auVar36 = vpsubd_avx2(auVar49,auVar28);
    auVar36 = vpaddd_avx2(auVar36,auVar29);
    auVar30 = vpsrad_avx2(auVar36,ZEXT416(uVar74));
    auVar36 = vpaddd_avx2(auVar28,auVar29);
    auVar36 = vpsubd_avx2(auVar49,auVar36);
    auVar31 = vpsrad_avx2(auVar36,ZEXT416(uVar74));
    auVar28 = vpmulld_avx2(auVar40,*(undefined1 (*) [32])((long)in[num_cols * 4] + lVar80));
    auVar36 = *(undefined1 (*) [32])((long)in[num_cols] + lVar80);
    auVar29 = vpmulld_avx2(auVar40,*(undefined1 (*) [32])((long)in[num_cols * 0xb] + lVar80));
    auVar28 = vpaddd_avx2(auVar28,auVar49);
    auVar37 = vpsubd_avx2(auVar28,auVar29);
    auVar83 = ZEXT416(uVar74);
    auVar32 = vpsrad_avx2(auVar37,auVar83);
    auVar28 = vpaddd_avx2(auVar28,auVar29);
    auVar33 = vpsrad_avx2(auVar28,auVar83);
    auVar29 = vpmulld_avx2(auVar40,*(undefined1 (*) [32])((long)in[num_cols * 6] + lVar80));
    auVar28 = *(undefined1 (*) [32])((long)in[num_cols * 0xe] + lVar80);
    auVar37 = vpmulld_avx2(auVar40,*(undefined1 (*) [32])((long)in[num_cols * 9] + lVar80));
    auVar29 = vpaddd_avx2(auVar29,auVar49);
    auVar38 = vpsubd_avx2(auVar29,auVar37);
    auVar34 = vpsrad_avx2(auVar38,auVar83);
    auVar29 = vpaddd_avx2(auVar29,auVar37);
    auVar35 = vpsrad_avx2(auVar29,auVar83);
    auVar37 = vpmulld_avx2(auVar40,*(undefined1 (*) [32])((long)in[num_cols * 5] + lVar80));
    auVar38 = vpmulld_avx2(auVar40,*(undefined1 (*) [32])((long)in[num_cols * 10] + lVar80));
    auVar29 = vpsubd_avx2(auVar49,auVar37);
    auVar29 = vpaddd_avx2(auVar38,auVar29);
    auVar37 = vpaddd_avx2(auVar37,auVar38);
    auVar38 = vpaddd_avx2(auVar13,auVar30);
    auVar39 = vpsubd_avx2(auVar13,auVar30);
    auVar40 = vpsubd_avx2(auVar31,auVar14);
    auVar14 = vpaddd_avx2(auVar14,auVar31);
    auVar41 = vpsubd_avx2(auVar32,auVar42);
    auVar30 = vpaddd_avx2(auVar32,auVar42);
    auVar31 = vpaddd_avx2(auVar33,auVar15);
    auVar33 = vpsubd_avx2(auVar15,auVar33);
    auVar42 = vpsubd_avx2(auVar34,auVar36);
    auVar15 = vpaddd_avx2(auVar34,auVar36);
    auVar36 = vpaddd_avx2(auVar35,auVar28);
    auVar35 = vpsubd_avx2(auVar28,auVar35);
    auVar13 = *(undefined1 (*) [32])((long)in[num_cols * 2] + lVar80);
    auVar83 = ZEXT416(uVar74);
    auVar29 = vpsrad_avx2(auVar29,auVar83);
    auVar28 = vpsubd_avx2(auVar49,auVar37);
    auVar37 = vpsrad_avx2(auVar28,auVar83);
    auVar28 = vpaddd_avx2(auVar29,auVar13);
    auVar34 = vpsubd_avx2(auVar13,auVar29);
    auVar13 = *(undefined1 (*) [32])((long)in[num_cols * 0xd] + lVar80);
    auVar43 = vpsubd_avx2(auVar37,auVar13);
    auVar13 = vpaddd_avx2(auVar37,auVar13);
    auVar64._4_4_ = iVar17;
    auVar64._0_4_ = iVar17;
    auVar64._8_4_ = iVar17;
    auVar64._12_4_ = iVar17;
    auVar64._16_4_ = iVar17;
    auVar64._20_4_ = iVar17;
    auVar64._24_4_ = iVar17;
    auVar64._28_4_ = iVar17;
    auVar29 = vpmulld_avx2(auVar41,auVar64);
    auVar29 = vpaddd_avx2(auVar49,auVar29);
    auVar65._4_4_ = iVar16;
    auVar65._0_4_ = iVar16;
    auVar65._8_4_ = iVar16;
    auVar65._12_4_ = iVar16;
    auVar65._16_4_ = iVar16;
    auVar65._20_4_ = iVar16;
    auVar65._24_4_ = iVar16;
    auVar65._28_4_ = iVar16;
    auVar37 = vpmulld_avx2(auVar31,auVar65);
    auVar29 = vpaddd_avx2(auVar37,auVar29);
    auVar37 = vpmulld_avx2(auVar41,auVar65);
    auVar63._4_4_ = iVar75;
    auVar63._0_4_ = iVar75;
    auVar63._8_4_ = iVar75;
    auVar63._12_4_ = iVar75;
    auVar63._16_4_ = iVar75;
    auVar63._20_4_ = iVar75;
    auVar63._24_4_ = iVar75;
    auVar63._28_4_ = iVar75;
    auVar31 = vpmulld_avx2(auVar31,auVar63);
    auVar37 = vpaddd_avx2(auVar49,auVar37);
    auVar37 = vpaddd_avx2(auVar37,auVar31);
    auVar32 = vpsubd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar30);
    auVar30 = vpmulld_avx2(auVar33,auVar64);
    auVar30 = vpaddd_avx2(auVar49,auVar30);
    auVar62._4_4_ = iVar66;
    auVar62._0_4_ = iVar66;
    auVar62._8_4_ = iVar66;
    auVar62._12_4_ = iVar66;
    auVar62._16_4_ = iVar66;
    auVar62._20_4_ = iVar66;
    auVar62._24_4_ = iVar66;
    auVar62._28_4_ = iVar66;
    auVar31 = vpmulld_avx2(auVar62,auVar32);
    auVar30 = vpaddd_avx2(auVar31,auVar30);
    auVar32 = vpmulld_avx2(auVar64,auVar32);
    auVar31 = vpmulld_avx2(auVar33,auVar65);
    auVar31 = vpaddd_avx2(auVar49,auVar31);
    auVar31 = vpaddd_avx2(auVar32,auVar31);
    auVar32 = vpmulld_avx2(auVar28,auVar64);
    auVar32 = vpaddd_avx2(auVar49,auVar32);
    auVar33 = vpmulld_avx2(auVar43,auVar65);
    auVar32 = vpaddd_avx2(auVar32,auVar33);
    auVar28 = vpmulld_avx2(auVar28,auVar65);
    auVar33 = vpmulld_avx2(auVar43,auVar63);
    auVar28 = vpaddd_avx2(auVar49,auVar28);
    auVar28 = vpaddd_avx2(auVar28,auVar33);
    auVar41 = vpsubd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar13);
    auVar13 = vpmulld_avx2(auVar34,auVar62);
    auVar13 = vpaddd_avx2(auVar49,auVar13);
    auVar33 = vpmulld_avx2(auVar64,auVar41);
    auVar13 = vpaddd_avx2(auVar33,auVar13);
    auVar33 = vpmulld_avx2(auVar34,auVar64);
    auVar34 = vpmulld_avx2(auVar65,auVar41);
    auVar33 = vpaddd_avx2(auVar49,auVar33);
    auVar33 = vpaddd_avx2(auVar33,auVar34);
    auVar34 = vpsrad_avx2(auVar29,auVar83);
    auVar29 = vpaddd_avx2(auVar34,auVar38);
    auVar41 = vpsubd_avx2(auVar38,auVar34);
    auVar38 = vpsrad_avx2(auVar37,auVar83);
    auVar37 = vpaddd_avx2(auVar38,auVar40);
    auVar40 = vpsubd_avx2(auVar40,auVar38);
    auVar30 = vpsrad_avx2(auVar30,auVar83);
    auVar38 = vpaddd_avx2(auVar30,auVar39);
    auVar39 = vpsubd_avx2(auVar39,auVar30);
    auVar30 = vpsrad_avx2(auVar31,auVar83);
    auVar43 = vpsubd_avx2(auVar30,auVar14);
    auVar14 = vpaddd_avx2(auVar30,auVar14);
    auVar31 = vpsrad_avx2(auVar32,auVar83);
    auVar30 = vpaddd_avx2(auVar31,auVar42);
    auVar34 = vpsubd_avx2(auVar42,auVar31);
    auVar31 = vpsrad_avx2(auVar28,auVar83);
    auVar28 = vpaddd_avx2(auVar31,auVar36);
    auVar42 = vpsubd_avx2(auVar36,auVar31);
    auVar83 = ZEXT416(uVar74);
    auVar13 = vpsrad_avx2(auVar13,auVar83);
    auVar32 = vpsubd_avx2(auVar13,auVar15);
    auVar13 = vpaddd_avx2(auVar13,auVar15);
    auVar36 = vpsrad_avx2(auVar33,auVar83);
    auVar15 = vpaddd_avx2(auVar36,auVar35);
    auVar35 = vpsubd_avx2(auVar35,auVar36);
    auVar61._4_4_ = iVar19;
    auVar61._0_4_ = iVar19;
    auVar61._8_4_ = iVar19;
    auVar61._12_4_ = iVar19;
    auVar61._16_4_ = iVar19;
    auVar61._20_4_ = iVar19;
    auVar61._24_4_ = iVar19;
    auVar61._28_4_ = iVar19;
    auVar36 = vpmulld_avx2(auVar30,auVar61);
    auVar36 = vpaddd_avx2(auVar49,auVar36);
    auVar60._4_4_ = iVar20;
    auVar60._0_4_ = iVar20;
    auVar60._8_4_ = iVar20;
    auVar60._12_4_ = iVar20;
    auVar60._16_4_ = iVar20;
    auVar60._20_4_ = iVar20;
    auVar60._24_4_ = iVar20;
    auVar60._28_4_ = iVar20;
    auVar31 = vpmulld_avx2(auVar28,auVar60);
    auVar36 = vpaddd_avx2(auVar31,auVar36);
    auVar30 = vpmulld_avx2(auVar30,auVar60);
    auVar58._4_4_ = iVar76;
    auVar58._0_4_ = iVar76;
    auVar58._8_4_ = iVar76;
    auVar58._12_4_ = iVar76;
    auVar58._16_4_ = iVar76;
    auVar58._20_4_ = iVar76;
    auVar58._24_4_ = iVar76;
    auVar58._28_4_ = iVar76;
    auVar31 = vpmulld_avx2(auVar28,auVar58);
    auVar28 = vpaddd_avx2(auVar49,auVar30);
    auVar28 = vpaddd_avx2(auVar28,auVar31);
    auVar57._4_4_ = iVar21;
    auVar57._0_4_ = iVar21;
    auVar57._8_4_ = iVar21;
    auVar57._12_4_ = iVar21;
    auVar57._16_4_ = iVar21;
    auVar57._20_4_ = iVar21;
    auVar57._24_4_ = iVar21;
    auVar57._28_4_ = iVar21;
    auVar30 = vpmulld_avx2(auVar32,auVar57);
    auVar30 = vpaddd_avx2(auVar49,auVar30);
    auVar44._4_4_ = uVar3;
    auVar44._0_4_ = uVar3;
    auVar44._8_4_ = uVar3;
    auVar44._12_4_ = uVar3;
    auVar44._16_4_ = uVar3;
    auVar44._20_4_ = uVar3;
    auVar44._24_4_ = uVar3;
    auVar44._28_4_ = uVar3;
    auVar31 = vpmulld_avx2(auVar15,auVar44);
    auVar30 = vpaddd_avx2(auVar30,auVar31);
    auVar31 = vpmulld_avx2(auVar32,auVar44);
    auVar32._4_4_ = iVar77;
    auVar32._0_4_ = iVar77;
    auVar32._8_4_ = iVar77;
    auVar32._12_4_ = iVar77;
    auVar32._16_4_ = iVar77;
    auVar32._20_4_ = iVar77;
    auVar32._24_4_ = iVar77;
    auVar32._28_4_ = iVar77;
    auVar32 = vpmulld_avx2(auVar15,auVar32);
    auVar15 = vpaddd_avx2(auVar49,auVar31);
    auVar15 = vpaddd_avx2(auVar15,auVar32);
    auVar59._4_4_ = iVar79;
    auVar59._0_4_ = iVar79;
    auVar59._8_4_ = iVar79;
    auVar59._12_4_ = iVar79;
    auVar59._16_4_ = iVar79;
    auVar59._20_4_ = iVar79;
    auVar59._24_4_ = iVar79;
    auVar59._28_4_ = iVar79;
    auVar31 = vpmulld_avx2(auVar34,auVar59);
    auVar31 = vpaddd_avx2(auVar49,auVar31);
    auVar32 = vpmulld_avx2(auVar42,auVar61);
    auVar31 = vpaddd_avx2(auVar31,auVar32);
    auVar32 = vpmulld_avx2(auVar34,auVar61);
    auVar33 = vpmulld_avx2(auVar42,auVar60);
    auVar32 = vpaddd_avx2(auVar49,auVar32);
    auVar32 = vpaddd_avx2(auVar32,auVar33);
    auVar33 = vpmulld_avx2(auVar13,auVar44);
    auVar33 = vpaddd_avx2(auVar49,auVar33);
    auVar34 = vpmulld_avx2(auVar35,auVar57);
    auVar33 = vpaddd_avx2(auVar33,auVar34);
    auVar34 = vpmulld_avx2(auVar35,auVar44);
    auVar13 = vpmulld_avx2(auVar57,auVar13);
    auVar13 = vpsubd_avx2(auVar49,auVar13);
    auVar13 = vpaddd_avx2(auVar13,auVar34);
    auVar34 = vpsrad_avx2(auVar36,auVar83);
    auVar36 = vpaddd_avx2(auVar34,auVar29);
    auVar34 = vpsubd_avx2(auVar29,auVar34);
    auVar29 = vpsrad_avx2(auVar28,auVar83);
    auVar28 = vpaddd_avx2(auVar29,auVar37);
    auVar35 = vpsubd_avx2(auVar37,auVar29);
    auVar37 = vpsrad_avx2(auVar30,auVar83);
    auVar29 = vpaddd_avx2(auVar37,auVar38);
    auVar42 = vpsubd_avx2(auVar38,auVar37);
    auVar37 = vpsrad_avx2(auVar15,auVar83);
    auVar15 = vpaddd_avx2(auVar37,auVar43);
    auVar43 = vpsubd_avx2(auVar43,auVar37);
    auVar38 = vpsrad_avx2(auVar31,auVar83);
    auVar37 = vpaddd_avx2(auVar38,auVar41);
    auVar41 = vpsubd_avx2(auVar41,auVar38);
    auVar30 = vpsrad_avx2(auVar32,auVar83);
    auVar38 = vpaddd_avx2(auVar30,auVar40);
    auVar40 = vpsubd_avx2(auVar40,auVar30);
    auVar31 = vpsrad_avx2(auVar33,auVar83);
    auVar30 = vpaddd_avx2(auVar31,auVar39);
    auVar44 = vpsubd_avx2(auVar39,auVar31);
    auVar13 = vpsrad_avx2(auVar13,auVar83);
    auVar32 = vpsubd_avx2(auVar13,auVar14);
    auVar13 = vpaddd_avx2(auVar13,auVar14);
    auVar14._4_4_ = iVar18;
    auVar14._0_4_ = iVar18;
    auVar14._8_4_ = iVar18;
    auVar14._12_4_ = iVar18;
    auVar14._16_4_ = iVar18;
    auVar14._20_4_ = iVar18;
    auVar14._24_4_ = iVar18;
    auVar14._28_4_ = iVar18;
    auVar14 = vpmulld_avx2(auVar36,auVar14);
    auVar14 = vpaddd_avx2(auVar14,auVar49);
    auVar48._4_4_ = uVar4;
    auVar48._0_4_ = uVar4;
    auVar48._8_4_ = uVar4;
    auVar48._12_4_ = uVar4;
    auVar48._16_4_ = uVar4;
    auVar48._20_4_ = uVar4;
    auVar48._24_4_ = uVar4;
    auVar48._28_4_ = uVar4;
    auVar31 = vpmulld_avx2(auVar28,auVar48);
    auVar14 = vpaddd_avx2(auVar14,auVar31);
    auVar36 = vpmulld_avx2(auVar36,auVar48);
    auVar56._4_4_ = iVar67;
    auVar56._0_4_ = iVar67;
    auVar56._8_4_ = iVar67;
    auVar56._12_4_ = iVar67;
    auVar56._16_4_ = iVar67;
    auVar56._20_4_ = iVar67;
    auVar56._24_4_ = iVar67;
    auVar56._28_4_ = iVar67;
    auVar28 = vpmulld_avx2(auVar28,auVar56);
    auVar36 = vpaddd_avx2(auVar49,auVar36);
    auVar36 = vpaddd_avx2(auVar36,auVar28);
    auVar28._4_4_ = iVar22;
    auVar28._0_4_ = iVar22;
    auVar28._8_4_ = iVar22;
    auVar28._12_4_ = iVar22;
    auVar28._16_4_ = iVar22;
    auVar28._20_4_ = iVar22;
    auVar28._24_4_ = iVar22;
    auVar28._28_4_ = iVar22;
    auVar28 = vpmulld_avx2(auVar29,auVar28);
    auVar28 = vpaddd_avx2(auVar49,auVar28);
    auVar47._4_4_ = uVar5;
    auVar47._0_4_ = uVar5;
    auVar47._8_4_ = uVar5;
    auVar47._12_4_ = uVar5;
    auVar47._16_4_ = uVar5;
    auVar47._20_4_ = uVar5;
    auVar47._24_4_ = uVar5;
    auVar47._28_4_ = uVar5;
    auVar31 = vpmulld_avx2(auVar15,auVar47);
    auVar28 = vpaddd_avx2(auVar28,auVar31);
    auVar29 = vpmulld_avx2(auVar29,auVar47);
    auVar55._4_4_ = iVar68;
    auVar55._0_4_ = iVar68;
    auVar55._8_4_ = iVar68;
    auVar55._12_4_ = iVar68;
    auVar55._16_4_ = iVar68;
    auVar55._20_4_ = iVar68;
    auVar55._24_4_ = iVar68;
    auVar55._28_4_ = iVar68;
    auVar31 = vpmulld_avx2(auVar15,auVar55);
    auVar15 = vpaddd_avx2(auVar49,auVar29);
    auVar15 = vpaddd_avx2(auVar15,auVar31);
    auVar29._4_4_ = iVar23;
    auVar29._0_4_ = iVar23;
    auVar29._8_4_ = iVar23;
    auVar29._12_4_ = iVar23;
    auVar29._16_4_ = iVar23;
    auVar29._20_4_ = iVar23;
    auVar29._24_4_ = iVar23;
    auVar29._28_4_ = iVar23;
    auVar29 = vpmulld_avx2(auVar37,auVar29);
    auVar29 = vpaddd_avx2(auVar49,auVar29);
    auVar46._4_4_ = uVar6;
    auVar46._0_4_ = uVar6;
    auVar46._8_4_ = uVar6;
    auVar46._12_4_ = uVar6;
    auVar46._16_4_ = uVar6;
    auVar46._20_4_ = uVar6;
    auVar46._24_4_ = uVar6;
    auVar46._28_4_ = uVar6;
    auVar31 = vpmulld_avx2(auVar38,auVar46);
    auVar29 = vpaddd_avx2(auVar29,auVar31);
    auVar37 = vpmulld_avx2(auVar37,auVar46);
    auVar54._4_4_ = iVar69;
    auVar54._0_4_ = iVar69;
    auVar54._8_4_ = iVar69;
    auVar54._12_4_ = iVar69;
    auVar54._16_4_ = iVar69;
    auVar54._20_4_ = iVar69;
    auVar54._24_4_ = iVar69;
    auVar54._28_4_ = iVar69;
    auVar38 = vpmulld_avx2(auVar38,auVar54);
    auVar37 = vpaddd_avx2(auVar49,auVar37);
    auVar37 = vpaddd_avx2(auVar37,auVar38);
    auVar38._4_4_ = iVar24;
    auVar38._0_4_ = iVar24;
    auVar38._8_4_ = iVar24;
    auVar38._12_4_ = iVar24;
    auVar38._16_4_ = iVar24;
    auVar38._20_4_ = iVar24;
    auVar38._24_4_ = iVar24;
    auVar38._28_4_ = iVar24;
    auVar38 = vpmulld_avx2(auVar30,auVar38);
    auVar38 = vpaddd_avx2(auVar49,auVar38);
    auVar39._4_4_ = uVar7;
    auVar39._0_4_ = uVar7;
    auVar39._8_4_ = uVar7;
    auVar39._12_4_ = uVar7;
    auVar39._16_4_ = uVar7;
    auVar39._20_4_ = uVar7;
    auVar39._24_4_ = uVar7;
    auVar39._28_4_ = uVar7;
    auVar31 = vpmulld_avx2(auVar32,auVar39);
    auVar38 = vpaddd_avx2(auVar38,auVar31);
    auVar30 = vpmulld_avx2(auVar30,auVar39);
    auVar53._4_4_ = iVar70;
    auVar53._0_4_ = iVar70;
    auVar53._8_4_ = iVar70;
    auVar53._12_4_ = iVar70;
    auVar53._16_4_ = iVar70;
    auVar53._20_4_ = iVar70;
    auVar53._24_4_ = iVar70;
    auVar53._28_4_ = iVar70;
    auVar31 = vpmulld_avx2(auVar32,auVar53);
    auVar30 = vpaddd_avx2(auVar49,auVar30);
    auVar30 = vpaddd_avx2(auVar30,auVar31);
    auVar31._4_4_ = iVar25;
    auVar31._0_4_ = iVar25;
    auVar31._8_4_ = iVar25;
    auVar31._12_4_ = iVar25;
    auVar31._16_4_ = iVar25;
    auVar31._20_4_ = iVar25;
    auVar31._24_4_ = iVar25;
    auVar31._28_4_ = iVar25;
    auVar31 = vpmulld_avx2(auVar34,auVar31);
    auVar31 = vpaddd_avx2(auVar49,auVar31);
    auVar33._4_4_ = uVar8;
    auVar33._0_4_ = uVar8;
    auVar33._8_4_ = uVar8;
    auVar33._12_4_ = uVar8;
    auVar33._16_4_ = uVar8;
    auVar33._20_4_ = uVar8;
    auVar33._24_4_ = uVar8;
    auVar33._28_4_ = uVar8;
    auVar32 = vpmulld_avx2(auVar35,auVar33);
    auVar31 = vpaddd_avx2(auVar31,auVar32);
    auVar32 = vpmulld_avx2(auVar34,auVar33);
    auVar52._4_4_ = iVar71;
    auVar52._0_4_ = iVar71;
    auVar52._8_4_ = iVar71;
    auVar52._12_4_ = iVar71;
    auVar52._16_4_ = iVar71;
    auVar52._20_4_ = iVar71;
    auVar52._24_4_ = iVar71;
    auVar52._28_4_ = iVar71;
    auVar33 = vpmulld_avx2(auVar35,auVar52);
    auVar32 = vpaddd_avx2(auVar49,auVar32);
    auVar32 = vpaddd_avx2(auVar32,auVar33);
    auVar34._4_4_ = iVar26;
    auVar34._0_4_ = iVar26;
    auVar34._8_4_ = iVar26;
    auVar34._12_4_ = iVar26;
    auVar34._16_4_ = iVar26;
    auVar34._20_4_ = iVar26;
    auVar34._24_4_ = iVar26;
    auVar34._28_4_ = iVar26;
    auVar33 = vpmulld_avx2(auVar42,auVar34);
    auVar33 = vpaddd_avx2(auVar49,auVar33);
    auVar35._4_4_ = uVar9;
    auVar35._0_4_ = uVar9;
    auVar35._8_4_ = uVar9;
    auVar35._12_4_ = uVar9;
    auVar35._16_4_ = uVar9;
    auVar35._20_4_ = uVar9;
    auVar35._24_4_ = uVar9;
    auVar35._28_4_ = uVar9;
    auVar34 = vpmulld_avx2(auVar43,auVar35);
    auVar33 = vpaddd_avx2(auVar33,auVar34);
    auVar34 = vpmulld_avx2(auVar42,auVar35);
    auVar51._4_4_ = iVar72;
    auVar51._0_4_ = iVar72;
    auVar51._8_4_ = iVar72;
    auVar51._12_4_ = iVar72;
    auVar51._16_4_ = iVar72;
    auVar51._20_4_ = iVar72;
    auVar51._24_4_ = iVar72;
    auVar51._28_4_ = iVar72;
    auVar35 = vpmulld_avx2(auVar43,auVar51);
    auVar34 = vpaddd_avx2(auVar49,auVar34);
    auVar34 = vpaddd_avx2(auVar34,auVar35);
    auVar50._4_4_ = iVar27;
    auVar50._0_4_ = iVar27;
    auVar50._8_4_ = iVar27;
    auVar50._12_4_ = iVar27;
    auVar50._16_4_ = iVar27;
    auVar50._20_4_ = iVar27;
    auVar50._24_4_ = iVar27;
    auVar50._28_4_ = iVar27;
    auVar35 = vpmulld_avx2(auVar41,auVar50);
    auVar35 = vpaddd_avx2(auVar49,auVar35);
    auVar42._4_4_ = uVar10;
    auVar42._0_4_ = uVar10;
    auVar42._8_4_ = uVar10;
    auVar42._12_4_ = uVar10;
    auVar42._16_4_ = uVar10;
    auVar42._20_4_ = uVar10;
    auVar42._24_4_ = uVar10;
    auVar42._28_4_ = uVar10;
    auVar39 = vpmulld_avx2(auVar40,auVar42);
    auVar35 = vpaddd_avx2(auVar35,auVar39);
    auVar39 = vpmulld_avx2(auVar41,auVar42);
    auVar41._4_4_ = iVar73;
    auVar41._0_4_ = iVar73;
    auVar41._8_4_ = iVar73;
    auVar41._12_4_ = iVar73;
    auVar41._16_4_ = iVar73;
    auVar41._20_4_ = iVar73;
    auVar41._24_4_ = iVar73;
    auVar41._28_4_ = iVar73;
    auVar40 = vpmulld_avx2(auVar40,auVar41);
    auVar39 = vpaddd_avx2(auVar49,auVar39);
    auVar39 = vpaddd_avx2(auVar39,auVar40);
    auVar45._4_4_ = uVar11;
    auVar45._0_4_ = uVar11;
    auVar45._8_4_ = uVar11;
    auVar45._12_4_ = uVar11;
    auVar45._16_4_ = uVar11;
    auVar45._20_4_ = uVar11;
    auVar45._24_4_ = uVar11;
    auVar45._28_4_ = uVar11;
    auVar40 = vpmulld_avx2(auVar44,auVar45);
    auVar40 = vpaddd_avx2(auVar49,auVar40);
    auVar43._4_4_ = uVar12;
    auVar43._0_4_ = uVar12;
    auVar43._8_4_ = uVar12;
    auVar43._12_4_ = uVar12;
    auVar43._16_4_ = uVar12;
    auVar43._20_4_ = uVar12;
    auVar43._24_4_ = uVar12;
    auVar43._28_4_ = uVar12;
    auVar41 = vpmulld_avx2(auVar43,auVar13);
    auVar42 = vpsubd_avx2(auVar40,auVar41);
    auVar40 = vpsrad_avx2(auVar14,auVar83);
    auVar36 = vpsrad_avx2(auVar36,auVar83);
    auVar28 = vpsrad_avx2(auVar28,auVar83);
    auVar41 = vpsrad_avx2(auVar15,auVar83);
    auVar29 = vpsrad_avx2(auVar29,auVar83);
    auVar37 = vpsrad_avx2(auVar37,auVar83);
    auVar83 = ZEXT416(uVar74);
    auVar38 = vpsrad_avx2(auVar38,auVar83);
    auVar30 = vpsrad_avx2(auVar30,auVar83);
    auVar31 = vpsrad_avx2(auVar31,auVar83);
    auVar32 = vpsrad_avx2(auVar32,auVar83);
    auVar33 = vpsrad_avx2(auVar33,auVar83);
    auVar34 = vpsrad_avx2(auVar34,auVar83);
    auVar35 = vpsrad_avx2(auVar35,auVar83);
    auVar39 = vpsrad_avx2(auVar39,auVar83);
    auVar42 = vpsrad_avx2(auVar42,auVar83);
    auVar14 = vpmulld_avx2(auVar44,auVar43);
    auVar15 = vpmulld_avx2(auVar13,auVar45);
    auVar13 = vpaddd_avx2(auVar49,auVar14);
    auVar13 = vpaddd_avx2(auVar13,auVar15);
    auVar13 = vpsrad_avx2(auVar13,auVar83);
    *(undefined1 (*) [32])((long)*out + lVar80) = auVar36;
    *(undefined1 (*) [32])((long)out[outstride] + lVar80) = auVar42;
    *(undefined1 (*) [32])((long)out[outstride * 2] + lVar80) = auVar41;
    *(undefined1 (*) [32])((long)out[outstride * 3] + lVar80) = auVar35;
    *(undefined1 (*) [32])((long)out[outstride * 4] + lVar80) = auVar37;
    *(undefined1 (*) [32])((long)out[outstride * 5] + lVar80) = auVar33;
    *(undefined1 (*) [32])((long)out[outstride * 6] + lVar80) = auVar30;
    *(undefined1 (*) [32])((long)out[outstride * 7] + lVar80) = auVar31;
    local_648 = auVar32._0_8_;
    uStack_640 = auVar32._8_8_;
    uStack_638 = auVar32._16_8_;
    uStack_630 = auVar32._24_8_;
    puVar1 = (undefined8 *)((long)out[outstride * 8] + lVar80);
    *puVar1 = local_648;
    puVar1[1] = uStack_640;
    puVar1[2] = uStack_638;
    puVar1[3] = uStack_630;
    local_628 = auVar38._0_8_;
    uStack_620 = auVar38._8_8_;
    uStack_618 = auVar38._16_8_;
    uStack_610 = auVar38._24_8_;
    puVar1 = (undefined8 *)((long)out[outstride * 9] + lVar80);
    *puVar1 = local_628;
    puVar1[1] = uStack_620;
    puVar1[2] = uStack_618;
    puVar1[3] = uStack_610;
    *(undefined1 (*) [32])((long)out[outstride * 10] + lVar80) = auVar34;
    local_6f8 = auVar29._0_8_;
    uStack_6f0 = auVar29._8_8_;
    uStack_6e8 = auVar29._16_8_;
    uStack_6e0 = auVar29._24_8_;
    puVar1 = (undefined8 *)((long)out[outstride * 0xb] + lVar80);
    *puVar1 = local_6f8;
    puVar1[1] = uStack_6f0;
    puVar1[2] = uStack_6e8;
    puVar1[3] = uStack_6e0;
    *(undefined1 (*) [32])((long)out[outstride * 0xc] + lVar80) = auVar39;
    local_6a8 = auVar28._0_8_;
    uStack_6a0 = auVar28._8_8_;
    uStack_698 = auVar28._16_8_;
    uStack_690 = auVar28._24_8_;
    puVar1 = (undefined8 *)((long)out[outstride * 0xd] + lVar80);
    *puVar1 = local_6a8;
    puVar1[1] = uStack_6a0;
    puVar1[2] = uStack_698;
    puVar1[3] = uStack_690;
    *(undefined1 (*) [32])((long)out[outstride * 0xe] + lVar80) = auVar13;
    local_688 = auVar40._0_8_;
    uStack_680 = auVar40._8_8_;
    uStack_678 = auVar40._16_8_;
    uStack_670 = auVar40._24_8_;
    puVar1 = (undefined8 *)((long)out[outstride * 0xf] + lVar80);
    *puVar1 = local_688;
    puVar1[1] = uStack_680;
    puVar1[2] = uStack_678;
    puVar1[3] = uStack_670;
  }
  return;
}

Assistant:

static void fadst16_avx2(__m256i *in, __m256i *out, const int8_t bit,
                         const int num_cols, const int outstride) {
  const int32_t *cospi = cospi_arr(bit);
  const __m256i cospi32 = _mm256_set1_epi32(cospi[32]);
  const __m256i cospi48 = _mm256_set1_epi32(cospi[48]);
  const __m256i cospi16 = _mm256_set1_epi32(cospi[16]);
  const __m256i cospim16 = _mm256_set1_epi32(-cospi[16]);
  const __m256i cospim48 = _mm256_set1_epi32(-cospi[48]);
  const __m256i cospi8 = _mm256_set1_epi32(cospi[8]);
  const __m256i cospi56 = _mm256_set1_epi32(cospi[56]);
  const __m256i cospim56 = _mm256_set1_epi32(-cospi[56]);
  const __m256i cospim8 = _mm256_set1_epi32(-cospi[8]);
  const __m256i cospi24 = _mm256_set1_epi32(cospi[24]);
  const __m256i cospim24 = _mm256_set1_epi32(-cospi[24]);
  const __m256i cospim40 = _mm256_set1_epi32(-cospi[40]);
  const __m256i cospi40 = _mm256_set1_epi32(cospi[40]);
  const __m256i cospi2 = _mm256_set1_epi32(cospi[2]);
  const __m256i cospi62 = _mm256_set1_epi32(cospi[62]);
  const __m256i cospim2 = _mm256_set1_epi32(-cospi[2]);
  const __m256i cospi10 = _mm256_set1_epi32(cospi[10]);
  const __m256i cospi54 = _mm256_set1_epi32(cospi[54]);
  const __m256i cospim10 = _mm256_set1_epi32(-cospi[10]);
  const __m256i cospi18 = _mm256_set1_epi32(cospi[18]);
  const __m256i cospi46 = _mm256_set1_epi32(cospi[46]);
  const __m256i cospim18 = _mm256_set1_epi32(-cospi[18]);
  const __m256i cospi26 = _mm256_set1_epi32(cospi[26]);
  const __m256i cospi38 = _mm256_set1_epi32(cospi[38]);
  const __m256i cospim26 = _mm256_set1_epi32(-cospi[26]);
  const __m256i cospi34 = _mm256_set1_epi32(cospi[34]);
  const __m256i cospi30 = _mm256_set1_epi32(cospi[30]);
  const __m256i cospim34 = _mm256_set1_epi32(-cospi[34]);
  const __m256i cospi42 = _mm256_set1_epi32(cospi[42]);
  const __m256i cospi22 = _mm256_set1_epi32(cospi[22]);
  const __m256i cospim42 = _mm256_set1_epi32(-cospi[42]);
  const __m256i cospi50 = _mm256_set1_epi32(cospi[50]);
  const __m256i cospi14 = _mm256_set1_epi32(cospi[14]);
  const __m256i cospim50 = _mm256_set1_epi32(-cospi[50]);
  const __m256i cospi58 = _mm256_set1_epi32(cospi[58]);
  const __m256i cospi6 = _mm256_set1_epi32(cospi[6]);
  const __m256i cospim58 = _mm256_set1_epi32(-cospi[58]);
  const __m256i rnding = _mm256_set1_epi32(1 << (bit - 1));
  const __m256i zero = _mm256_setzero_si256();

  __m256i u[16], v[16], x, y;
  int col;

  for (col = 0; col < num_cols; ++col) {
    // stage 0
    // stage 1
    u[0] = in[0 * num_cols + col];
    u[1] = _mm256_sub_epi32(zero, in[15 * num_cols + col]);
    u[2] = _mm256_sub_epi32(zero, in[7 * num_cols + col]);
    u[3] = in[8 * num_cols + col];
    u[4] = _mm256_sub_epi32(zero, in[3 * num_cols + col]);
    u[5] = in[12 * num_cols + col];
    u[6] = in[4 * num_cols + col];
    u[7] = _mm256_sub_epi32(zero, in[11 * num_cols + col]);
    u[8] = _mm256_sub_epi32(zero, in[1 * num_cols + col]);
    u[9] = in[14 * num_cols + col];
    u[10] = in[6 * num_cols + col];
    u[11] = _mm256_sub_epi32(zero, in[9 * num_cols + col]);
    u[12] = in[2 * num_cols + col];
    u[13] = _mm256_sub_epi32(zero, in[13 * num_cols + col]);
    u[14] = _mm256_sub_epi32(zero, in[5 * num_cols + col]);
    u[15] = in[10 * num_cols + col];

    // stage 2
    v[0] = u[0];
    v[1] = u[1];

    x = _mm256_mullo_epi32(u[2], cospi32);
    y = _mm256_mullo_epi32(u[3], cospi32);
    v[2] = _mm256_add_epi32(x, y);
    v[2] = _mm256_add_epi32(v[2], rnding);
    v[2] = _mm256_srai_epi32(v[2], bit);

    v[3] = _mm256_sub_epi32(x, y);
    v[3] = _mm256_add_epi32(v[3], rnding);
    v[3] = _mm256_srai_epi32(v[3], bit);

    v[4] = u[4];
    v[5] = u[5];

    x = _mm256_mullo_epi32(u[6], cospi32);
    y = _mm256_mullo_epi32(u[7], cospi32);
    v[6] = _mm256_add_epi32(x, y);
    v[6] = _mm256_add_epi32(v[6], rnding);
    v[6] = _mm256_srai_epi32(v[6], bit);

    v[7] = _mm256_sub_epi32(x, y);
    v[7] = _mm256_add_epi32(v[7], rnding);
    v[7] = _mm256_srai_epi32(v[7], bit);

    v[8] = u[8];
    v[9] = u[9];

    x = _mm256_mullo_epi32(u[10], cospi32);
    y = _mm256_mullo_epi32(u[11], cospi32);
    v[10] = _mm256_add_epi32(x, y);
    v[10] = _mm256_add_epi32(v[10], rnding);
    v[10] = _mm256_srai_epi32(v[10], bit);

    v[11] = _mm256_sub_epi32(x, y);
    v[11] = _mm256_add_epi32(v[11], rnding);
    v[11] = _mm256_srai_epi32(v[11], bit);

    v[12] = u[12];
    v[13] = u[13];

    x = _mm256_mullo_epi32(u[14], cospi32);
    y = _mm256_mullo_epi32(u[15], cospi32);
    v[14] = _mm256_add_epi32(x, y);
    v[14] = _mm256_add_epi32(v[14], rnding);
    v[14] = _mm256_srai_epi32(v[14], bit);

    v[15] = _mm256_sub_epi32(x, y);
    v[15] = _mm256_add_epi32(v[15], rnding);
    v[15] = _mm256_srai_epi32(v[15], bit);

    // stage 3
    u[0] = _mm256_add_epi32(v[0], v[2]);
    u[1] = _mm256_add_epi32(v[1], v[3]);
    u[2] = _mm256_sub_epi32(v[0], v[2]);
    u[3] = _mm256_sub_epi32(v[1], v[3]);
    u[4] = _mm256_add_epi32(v[4], v[6]);
    u[5] = _mm256_add_epi32(v[5], v[7]);
    u[6] = _mm256_sub_epi32(v[4], v[6]);
    u[7] = _mm256_sub_epi32(v[5], v[7]);
    u[8] = _mm256_add_epi32(v[8], v[10]);
    u[9] = _mm256_add_epi32(v[9], v[11]);
    u[10] = _mm256_sub_epi32(v[8], v[10]);
    u[11] = _mm256_sub_epi32(v[9], v[11]);
    u[12] = _mm256_add_epi32(v[12], v[14]);
    u[13] = _mm256_add_epi32(v[13], v[15]);
    u[14] = _mm256_sub_epi32(v[12], v[14]);
    u[15] = _mm256_sub_epi32(v[13], v[15]);

    // stage 4
    v[0] = u[0];
    v[1] = u[1];
    v[2] = u[2];
    v[3] = u[3];
    v[4] = av1_half_btf_avx2(&cospi16, &u[4], &cospi48, &u[5], &rnding, bit);
    v[5] = av1_half_btf_avx2(&cospi48, &u[4], &cospim16, &u[5], &rnding, bit);
    v[6] = av1_half_btf_avx2(&cospim48, &u[6], &cospi16, &u[7], &rnding, bit);
    v[7] = av1_half_btf_avx2(&cospi16, &u[6], &cospi48, &u[7], &rnding, bit);
    v[8] = u[8];
    v[9] = u[9];
    v[10] = u[10];
    v[11] = u[11];
    v[12] = av1_half_btf_avx2(&cospi16, &u[12], &cospi48, &u[13], &rnding, bit);
    v[13] =
        av1_half_btf_avx2(&cospi48, &u[12], &cospim16, &u[13], &rnding, bit);
    v[14] =
        av1_half_btf_avx2(&cospim48, &u[14], &cospi16, &u[15], &rnding, bit);
    v[15] = av1_half_btf_avx2(&cospi16, &u[14], &cospi48, &u[15], &rnding, bit);

    // stage 5
    u[0] = _mm256_add_epi32(v[0], v[4]);
    u[1] = _mm256_add_epi32(v[1], v[5]);
    u[2] = _mm256_add_epi32(v[2], v[6]);
    u[3] = _mm256_add_epi32(v[3], v[7]);
    u[4] = _mm256_sub_epi32(v[0], v[4]);
    u[5] = _mm256_sub_epi32(v[1], v[5]);
    u[6] = _mm256_sub_epi32(v[2], v[6]);
    u[7] = _mm256_sub_epi32(v[3], v[7]);
    u[8] = _mm256_add_epi32(v[8], v[12]);
    u[9] = _mm256_add_epi32(v[9], v[13]);
    u[10] = _mm256_add_epi32(v[10], v[14]);
    u[11] = _mm256_add_epi32(v[11], v[15]);
    u[12] = _mm256_sub_epi32(v[8], v[12]);
    u[13] = _mm256_sub_epi32(v[9], v[13]);
    u[14] = _mm256_sub_epi32(v[10], v[14]);
    u[15] = _mm256_sub_epi32(v[11], v[15]);

    // stage 6
    v[0] = u[0];
    v[1] = u[1];
    v[2] = u[2];
    v[3] = u[3];
    v[4] = u[4];
    v[5] = u[5];
    v[6] = u[6];
    v[7] = u[7];
    v[8] = av1_half_btf_avx2(&cospi8, &u[8], &cospi56, &u[9], &rnding, bit);
    v[9] = av1_half_btf_avx2(&cospi56, &u[8], &cospim8, &u[9], &rnding, bit);
    v[10] = av1_half_btf_avx2(&cospi40, &u[10], &cospi24, &u[11], &rnding, bit);
    v[11] =
        av1_half_btf_avx2(&cospi24, &u[10], &cospim40, &u[11], &rnding, bit);
    v[12] = av1_half_btf_avx2(&cospim56, &u[12], &cospi8, &u[13], &rnding, bit);
    v[13] = av1_half_btf_avx2(&cospi8, &u[12], &cospi56, &u[13], &rnding, bit);
    v[14] =
        av1_half_btf_avx2(&cospim24, &u[14], &cospi40, &u[15], &rnding, bit);
    v[15] = av1_half_btf_avx2(&cospi40, &u[14], &cospi24, &u[15], &rnding, bit);

    // stage 7
    u[0] = _mm256_add_epi32(v[0], v[8]);
    u[1] = _mm256_add_epi32(v[1], v[9]);
    u[2] = _mm256_add_epi32(v[2], v[10]);
    u[3] = _mm256_add_epi32(v[3], v[11]);
    u[4] = _mm256_add_epi32(v[4], v[12]);
    u[5] = _mm256_add_epi32(v[5], v[13]);
    u[6] = _mm256_add_epi32(v[6], v[14]);
    u[7] = _mm256_add_epi32(v[7], v[15]);
    u[8] = _mm256_sub_epi32(v[0], v[8]);
    u[9] = _mm256_sub_epi32(v[1], v[9]);
    u[10] = _mm256_sub_epi32(v[2], v[10]);
    u[11] = _mm256_sub_epi32(v[3], v[11]);
    u[12] = _mm256_sub_epi32(v[4], v[12]);
    u[13] = _mm256_sub_epi32(v[5], v[13]);
    u[14] = _mm256_sub_epi32(v[6], v[14]);
    u[15] = _mm256_sub_epi32(v[7], v[15]);

    // stage 8
    v[0] = av1_half_btf_avx2(&cospi2, &u[0], &cospi62, &u[1], &rnding, bit);
    v[1] = av1_half_btf_avx2(&cospi62, &u[0], &cospim2, &u[1], &rnding, bit);
    v[2] = av1_half_btf_avx2(&cospi10, &u[2], &cospi54, &u[3], &rnding, bit);
    v[3] = av1_half_btf_avx2(&cospi54, &u[2], &cospim10, &u[3], &rnding, bit);
    v[4] = av1_half_btf_avx2(&cospi18, &u[4], &cospi46, &u[5], &rnding, bit);
    v[5] = av1_half_btf_avx2(&cospi46, &u[4], &cospim18, &u[5], &rnding, bit);
    v[6] = av1_half_btf_avx2(&cospi26, &u[6], &cospi38, &u[7], &rnding, bit);
    v[7] = av1_half_btf_avx2(&cospi38, &u[6], &cospim26, &u[7], &rnding, bit);
    v[8] = av1_half_btf_avx2(&cospi34, &u[8], &cospi30, &u[9], &rnding, bit);
    v[9] = av1_half_btf_avx2(&cospi30, &u[8], &cospim34, &u[9], &rnding, bit);
    v[10] = av1_half_btf_avx2(&cospi42, &u[10], &cospi22, &u[11], &rnding, bit);
    v[11] =
        av1_half_btf_avx2(&cospi22, &u[10], &cospim42, &u[11], &rnding, bit);
    v[12] = av1_half_btf_avx2(&cospi50, &u[12], &cospi14, &u[13], &rnding, bit);
    v[13] =
        av1_half_btf_avx2(&cospi14, &u[12], &cospim50, &u[13], &rnding, bit);
    v[14] = av1_half_btf_avx2(&cospi58, &u[14], &cospi6, &u[15], &rnding, bit);
    v[15] = av1_half_btf_avx2(&cospi6, &u[14], &cospim58, &u[15], &rnding, bit);

    // stage 9
    out[0 * outstride + col] = v[1];
    out[1 * outstride + col] = v[14];
    out[2 * outstride + col] = v[3];
    out[3 * outstride + col] = v[12];
    out[4 * outstride + col] = v[5];
    out[5 * outstride + col] = v[10];
    out[6 * outstride + col] = v[7];
    out[7 * outstride + col] = v[8];
    out[8 * outstride + col] = v[9];
    out[9 * outstride + col] = v[6];
    out[10 * outstride + col] = v[11];
    out[11 * outstride + col] = v[4];
    out[12 * outstride + col] = v[13];
    out[13 * outstride + col] = v[2];
    out[14 * outstride + col] = v[15];
    out[15 * outstride + col] = v[0];
  }
}